

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void xml_error_strings(TidyDoc tdoc)

{
  uint messageType;
  TidyIterator p_Var1;
  ctmbstr ptVar2;
  ctmbstr ptVar3;
  TidyIterator j;
  TidyIterator local_38;
  
  p_Var1 = getErrorCodeList();
  local_38 = p_Var1;
  puts("<?xml version=\"1.0\"?>");
  ptVar2 = tidyLibraryVersion();
  printf("<error_strings version=\"%s\">\n",ptVar2);
  while (p_Var1 != (TidyIterator)0x0) {
    messageType = getNextErrorCode(&local_38);
    ptVar2 = tidyLocalizedString(messageType);
    puts(" <error_string>");
    ptVar3 = tidyErrorCodeAsKey(messageType);
    printf("  <name>%s</name>\n",ptVar3);
    ptVar3 = tidyGetLanguage();
    if (ptVar2 == (ctmbstr)0x0) {
      printf("  <string class=\"%s\">NULL</string>\n",ptVar3);
    }
    else {
      printf("  <string class=\"%s\"><![CDATA[%s]]></string>\n",ptVar3,ptVar2);
    }
    puts(" </error_string>");
    p_Var1 = local_38;
  }
  puts("</error_strings>");
  return;
}

Assistant:

static void xml_error_strings( TidyDoc tdoc )
{
    uint errorCode;
    ctmbstr localizedString;
    TidyIterator j = getErrorCodeList();

    printf( "<?xml version=\"1.0\"?>\n" );
    printf( "<error_strings version=\"%s\">\n", tidyLibraryVersion());

    while (j) {
        errorCode = getNextErrorCode(&j);
        localizedString = tidyLocalizedString(errorCode);
        printf( " <error_string>\n" );
        printf( "  <name>%s</name>\n", tidyErrorCodeAsKey(errorCode));
        if ( localizedString )
            printf( "  <string class=\"%s\"><![CDATA[%s]]></string>\n", tidyGetLanguage(), localizedString );
        else
            printf( "  <string class=\"%s\">NULL</string>\n", tidyGetLanguage() );

        printf( " </error_string>\n" );
    }
    
    printf( "</error_strings>\n" );
}